

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageview.cpp
# Opt level: O0

int __thiscall QtMWidgets::PageView::indexOf(PageView *this,QWidget *widget)

{
  PageViewPrivate *pPVar1;
  qsizetype qVar2;
  const_reference ppQVar3;
  int local_24;
  int i;
  QWidget *widget_local;
  PageView *this_local;
  
  local_24 = 0;
  while( true ) {
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    qVar2 = QList<QWidget_*>::count(&pPVar1->pages);
    if (qVar2 <= local_24) {
      return -1;
    }
    pPVar1 = QScopedPointer<QtMWidgets::PageViewPrivate,_QScopedPointerDeleter<QtMWidgets::PageViewPrivate>_>
             ::operator->(&this->d);
    ppQVar3 = QList<QWidget_*>::at(&pPVar1->pages,(long)local_24);
    if (*ppQVar3 == widget) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int
PageView::indexOf( QWidget * widget ) const
{
	for( int i = 0; i < d->pages.count(); ++i )
	{
		if( d->pages.at( i ) == widget )
			return i;
	}

	return -1;
}